

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendEquation(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   *this,GLenum mode)

{
  int in_ESI;
  long in_RDI;
  GLuint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  if ((**(int **)(in_RDI + 0x50) != in_ESI) || ((*(byte *)(in_RDI + 0x80) & 1) != 0)) {
    COpenGLExtensionHandler::irrGlBlendEquation
              ((COpenGLExtensionHandler *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (GLenum)((ulong)in_RDI >> 0x20));
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 0x48); uVar1 = uVar1 + 1) {
      *(int *)(*(long *)(in_RDI + 0x50) + (ulong)uVar1 * 4) = in_ESI;
    }
    *(undefined1 *)(in_RDI + 0x80) = 0;
  }
  return;
}

Assistant:

void setBlendEquation(GLenum mode)
	{
		if (BlendEquation[0] != mode || BlendEquationInvalid) {
			Driver->irrGlBlendEquation(mode);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				BlendEquation[i] = mode;

			BlendEquationInvalid = false;
		}
	}